

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void display_word(char *word,char *attempted_letters)

{
  char *pcVar1;
  int __c;
  
  for (; __c = (int)*word, *word != '\0'; word = word + 1) {
    pcVar1 = strchr(attempted_letters,__c);
    if (pcVar1 == (char *)0x0) {
      __c = 0x2d;
    }
    putchar(__c);
  }
  putchar(10);
  return;
}

Assistant:

void display_word(const char* word, char attempted_letters[27]) {
  for (size_t n = 0; word[n]; n++) {
    if (strchr(attempted_letters, word[n]) != NULL) {
      printf("%c", word[n]);
    } else {
      printf("-");
    }
  }
  printf("\n");
}